

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O2

int rtr_bgpsec_validate_as_path(rtr_bgpsec *data,spki_table *table)

{
  ushort uVar1;
  undefined2 uVar2;
  int iVar3;
  size_t sVar4;
  stream *s;
  rtr_signature_seg *prVar5;
  uint8_t *buff;
  long lVar6;
  char *frmt;
  rtr_signature_seg *prVar7;
  uint uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  uint router_keys_len;
  spki_record *tmp_key;
  uchar *hash_result;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (table == (spki_table *)0x0) {
    lrtr_dbg("BGPSEC: TRYING TO VALIDATE A, BUT NO SPKI TABLE INITIALIZED");
    iVar3 = -1;
  }
  else {
    hash_result = (uchar *)0x0;
    tmp_key = (spki_record *)0x0;
    iVar3 = -9;
    if (((data != (rtr_bgpsec *)0x0) && (data->path != (rtr_secure_path_seg *)0x0)) &&
       (prVar7 = data->sigs, prVar7 != (rtr_signature_seg *)0x0)) {
      if (data->sigs_len == (ushort)data->path_len) {
        iVar3 = rtr_bgpsec_has_algorithm_suite(data->alg);
        if (iVar3 == -1) {
          iVar3 = -6;
        }
        else {
          uVar2 = data->nlri->afi;
          if ((ushort)(uVar2 - 1) < 2) {
            iVar3 = check_router_keys(prVar7,table);
            if (iVar3 == 0) {
              uVar8 = 0;
              sVar4 = req_stream_size(data,VALIDATION);
              s = init_stream((uint16_t)sVar4);
              iVar3 = align_byte_sequence(data,s,VALIDATION);
              if (iVar3 == 0) {
                prVar7 = data->sigs;
                iVar3 = 1;
                while( true ) {
                  sVar4 = get_stream_size(s);
                  if ((iVar3 != 1) || (sVar4 < uVar8)) goto LAB_00110e21;
                  prVar5 = prVar7->next;
                  if (prVar7->next == (rtr_signature_seg *)0x0) {
                    prVar5 = prVar7;
                  }
                  uVar1 = prVar5->sig_len;
                  sVar4 = get_stream_size(s);
                  sVar4 = sVar4 - uVar8;
                  buff = (uint8_t *)lrtr_malloc(sVar4);
                  read_stream_at(buff,s,(uint16_t)uVar8,(uint16_t)sVar4);
                  iVar3 = hash_byte_sequence(buff,sVar4,data->alg,&hash_result);
                  lrtr_free(buff);
                  if (iVar3 != 0) goto LAB_00110e21;
                  router_keys_len = 0;
                  iVar3 = spki_table_search_by_ski(table,prVar7->ski,&tmp_key,&router_keys_len);
                  if (iVar3 == -1) break;
                  uVar9 = 0xffffffffffffffff;
                  iVar3 = 0;
                  lVar6 = 0;
                  do {
                    uVar9 = uVar9 + 1;
                    if (router_keys_len <= uVar9) goto LAB_00110ddf;
                    if (data->alg != '\x01') {
                      iVar3 = -6;
                      goto LAB_00110e21;
                    }
                    iVar3 = validate_signature(hash_result,prVar7,
                                               (spki_record *)(tmp_key->ski + lVar6));
                    lVar6 = lVar6 + 0x80;
                  } while (iVar3 != 1);
                  iVar3 = 1;
LAB_00110ddf:
                  lrtr_free(hash_result);
                  lrtr_free(tmp_key);
                  hash_result = (uchar *)0x0;
                  tmp_key = (spki_record *)0x0;
                  prVar7 = prVar7->next;
                  uVar8 = uVar8 + uVar1 + 0x1c;
                }
                iVar3 = -1;
              }
            }
            else {
              s = (stream *)0x0;
            }
LAB_00110e21:
            if (hash_result != (uchar *)0x0) {
              lrtr_free(hash_result);
            }
            if (tmp_key != (spki_record *)0x0) {
              lrtr_free(tmp_key);
            }
            if (s != (stream *)0x0) {
              free_stream(s);
            }
            if (iVar3 == 1) {
              frmt = "BGPSEC: Validation result for the whole BGPsec_PATH: valid";
            }
            else {
              if (iVar3 != 2) goto LAB_00110c79;
              frmt = "BGPSEC: Validation result for the whole BGPsec_PATH: invalid";
            }
            lrtr_dbg(frmt);
          }
          else {
            iVar3 = -7;
          }
        }
      }
      else {
        iVar3 = -8;
      }
    }
  }
LAB_00110c79:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int rtr_bgpsec_validate_as_path(const struct rtr_bgpsec *data, struct spki_table *table)
{
	if (table == NULL) {
		BGPSEC_DBG1("TRYING TO VALIDATE A, BUT NO SPKI TABLE INITIALIZED");
		return RTR_BGPSEC_ERROR;
	}

	/* The AS path validation result. */
	enum rtr_bgpsec_rtvals retval = 0;

	/* The resulting hash. */
	unsigned char *hash_result = NULL;

	/* A temporare spki record */
	struct spki_record *tmp_key = NULL;

	/* A stream that holds the data that is hashed */
	struct stream *s = NULL;

	/* Total size of required space for the stream */
	unsigned int stream_size = 0;

	/* Use a temp variable in the validation loop since we don't want to
	 * alter data->sigs.
	 */
	struct rtr_signature_seg *tmp_sig = NULL;

	/* Temp variable that holds the signature length of the of the
	 * next signature segment.
	 */
	int tmp_sig_len = 0;

	/* Check, if the parameters are not NULL */
	if (!data || !data->path || !data->sigs || !table)
		return RTR_BGPSEC_INVALID_ARGUMENTS;

	/* Check, if there are as many signature segments as there are
	 * secure path segments
	 */
	if (data->path_len != data->sigs_len)
		return RTR_BGPSEC_WRONG_SEGMENT_COUNT;

	/* Check, if the algorithm suite is supported by RTRlib. */
	if (rtr_bgpsec_has_algorithm_suite(data->alg) == RTR_BGPSEC_ERROR)
		return RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE;

	/* Check, if the AFI is usable with BGPsec */
	if ((data->nlri->afi != BGPSEC_IPV4) && (data->nlri->afi != BGPSEC_IPV6))
		return RTR_BGPSEC_UNSUPPORTED_AFI;

	/* Make sure that all router keys are available. */
	retval = check_router_keys(data->sigs, table);

	if (retval != RTR_BGPSEC_SUCCESS)
		goto err;

	/* Calculate the required stream size and initialize the stream */
	stream_size = req_stream_size(data, VALIDATION);
	s = init_stream(stream_size);

	/* Align the byte sequence and store it in the stream */
	retval = align_byte_sequence(data, s, VALIDATION);

	if (retval != RTR_BGPSEC_SUCCESS)
		goto err;

	/*
	 * The validation is an iterative process. In the first iteration,
	 * the entire byte sequence is hashed to validate the first signature.
	 * In the next iteration, the process is repeated. This time, the
	 * starting position for hashing is moved by an offset to only hash
	 * the data required to validate the next signature. This procedure
	 * is repeated until all signatures are validated or a signature is
	 * determined invalid.
	 *
	 * offset: the current position from where on the bytes should
	 * be hashed.
	 *
	 * next_offset: adds to offset, after the bytes on the
	 * current offset have been processed. next_offset is not
	 * constant and must be calculated each iteration:
	 *
	 * signature length +
	 * SKI size +
	 * sizeof(var that holds signature length) +
	 * sizeof(a secure path segment)
	 *
	 *
	 *  offset
	 * |o++++++++++++++++++++++++++++++++++++++++| bytes
	 *
	 *		offset+=
	 *		new_offset
	 * |------------o++++++++++++++++++++++++++++| bytes
	 *
	 *			    offset+=
	 *			    new_offset
	 * |------------------------o++++++++++++++++| bytes
	 *
	 *
	 * A more detailed view can be found at
	 *https://mailarchive.ietf.org/arch/msg/sidr/8B_e4CNxQCUKeZ_AUzsdnn2f5Mu
	 **/

	/* Set retval to RTR_BGPSEC_VALID so the for-condition does not
	 * fail on the first for loop check.
	 */
	retval = RTR_BGPSEC_VALID;
	tmp_sig = data->sigs;

	for (unsigned int offset = 0, next_offset = 0; offset <= get_stream_size(s) && retval == RTR_BGPSEC_VALID;
	     offset += next_offset) {
		if (tmp_sig->next)
			tmp_sig_len = tmp_sig->next->sig_len;
		else
			tmp_sig_len = tmp_sig->sig_len;

		next_offset = tmp_sig_len + SKI_SIZE + sizeof(tmp_sig->sig_len) + SECURE_PATH_SEG_SIZE;

		/*
		 * From a certain position on, read until the end of the stream.
		 * The starting position is determined by the offset. The end
		 * of the stream is the total length minus the offset.
		 * The curr pointer points to the resulting "sub-stream".
		 * Hacky, could be improved.
		 */
		size_t len = get_stream_size(s) - offset;

		uint8_t *curr = lrtr_malloc(len);

		read_stream_at(curr, s, offset, len);

		retval = hash_byte_sequence(curr, len, data->alg, &hash_result);

		lrtr_free(curr);

		if (retval != RTR_BGPSEC_SUCCESS)
			goto err;

		/* Store all router keys for the given SKI in tmp_key. */
		unsigned int router_keys_len = 0;
		enum spki_rtvals spki_retval =
			spki_table_search_by_ski(table, tmp_sig->ski, &tmp_key, &router_keys_len);
		if (spki_retval == SPKI_ERROR) {
			retval = RTR_BGPSEC_ERROR;
			goto err;
		}

		/* Loop in case there are multiple router keys for one SKI. */
		for (unsigned int j = 0; j < router_keys_len; j++) {
			/* Validate the siganture depending on the algorithm
			 * suite. More if-cases are added with new algorithm
			 * suites.
			 */
			if (data->alg == RTR_BGPSEC_ALGORITHM_SUITE_1) {
				retval = validate_signature(hash_result, tmp_sig, &tmp_key[j]);
			} else {
				retval = RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE;
				goto err;
			}
			/* As soon as one of the router keys produces a valid
			 * result, exit the loop.
			 */
			if (retval == RTR_BGPSEC_VALID)
				break;
		}
		lrtr_free(hash_result);
		lrtr_free(tmp_key);
		hash_result = NULL;
		tmp_key = NULL;
		tmp_sig = tmp_sig->next;
	}

err:
	if (hash_result)
		lrtr_free(hash_result);
	if (tmp_key)
		lrtr_free(tmp_key);
	if (s)
		free_stream(s);

	if (retval == RTR_BGPSEC_VALID)
		BGPSEC_DBG1("Validation result for the whole BGPsec_PATH: valid");
	else if (retval == RTR_BGPSEC_NOT_VALID)
		BGPSEC_DBG1("Validation result for the whole BGPsec_PATH: invalid");

	return retval;
}